

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinExport::WriteBinaryAnim(AssbinExport *this,IOStream *container,aiAnimation *anim)

{
  uint uVar1;
  ulong uVar2;
  uint32_t t;
  AssbinChunkWriter chunk;
  uint local_5c;
  AssbinChunkWriter local_58;
  
  local_58.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_009b2890;
  local_58.buffer = (uint8_t *)0x0;
  local_58.magic = 0x123b;
  local_58.cur_size = 0;
  local_58.cursor = 0;
  local_58.initial = 0x1000;
  uVar1 = (anim->mName).length;
  local_58.container = container;
  AssbinChunkWriter::Grow(&local_58,4);
  *(ai_uint32 *)(local_58.buffer + local_58.cursor) = (anim->mName).length;
  local_58.cursor = local_58.cursor + 4;
  (*local_58.super_IOStream._vptr_IOStream[3])(&local_58,(anim->mName).data,(ulong)uVar1,1);
  (*local_58.super_IOStream._vptr_IOStream[3])(&local_58,&anim->mDuration,8,1);
  (*local_58.super_IOStream._vptr_IOStream[3])(&local_58,&anim->mTicksPerSecond,8,1);
  local_5c = anim->mNumChannels;
  (*local_58.super_IOStream._vptr_IOStream[3])(&local_58,&local_5c,4,1);
  if (anim->mNumChannels != 0) {
    uVar2 = 0;
    do {
      WriteBinaryNodeAnim(this,&local_58.super_IOStream,anim->mChannels[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < anim->mNumChannels);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_58);
  return;
}

Assistant:

void WriteBinaryAnim( IOStream * container, const aiAnimation* anim )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIANIMATION );

        Write<aiString>(&chunk,anim->mName);
        Write<double>(&chunk,anim->mDuration);
        Write<double>(&chunk,anim->mTicksPerSecond);
        Write<unsigned int>(&chunk,anim->mNumChannels);

        for (unsigned int a = 0; a < anim->mNumChannels;++a) {
            const aiNodeAnim* nd = anim->mChannels[a];
            WriteBinaryNodeAnim(&chunk,nd);
        }
    }